

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedRep
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  MapKeyComparator *key_comparator;
  string *psVar10;
  int v2;
  int index;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  Metadata MVar15;
  Metadata MVar16;
  int local_fc;
  vector<int,_std::allocator<int>_> match_list1;
  vector<int,_std::allocator<int>_> match_list2;
  SpecificField local_a0;
  LogMessageFatal local_40 [16];
  
  bVar2 = FieldDescriptor::is_repeated(repeated_field);
  if (!bVar2) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
               ,0x4cf,0x1d,"repeated_field->is_repeated()");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a0);
  }
  MVar15 = Message::GetMetadata(message1);
  MVar16 = Message::GetMetadata(message2);
  uVar8 = Reflection::FieldSize(MVar15.reflection,message1,repeated_field);
  uVar9 = Reflection::FieldSize(MVar16.reflection,message2,repeated_field);
  bVar2 = IsTreatedAsSubset(this,repeated_field);
  if (this->reporter_ == (Reporter *)0x0 && (uVar8 != uVar9 && ((int)uVar9 <= (int)uVar8 || !bVar2))
     ) {
    return false;
  }
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  key_comparator = GetMapKeyComparator(this,repeated_field);
  bVar3 = IsTreatedAsSmartList(this,repeated_field);
  if ((key_comparator != (MapKeyComparator *)0x0) ||
     (bVar4 = IsTreatedAsSet(this,repeated_field), bVar4)) {
LAB_002de42e:
    bVar6 = MatchRepeatedFieldIndices
                      (this,message1,message2,unpacked_any,repeated_field,key_comparator,
                       parent_fields,&match_list1,&match_list2);
    bVar5 = false;
    bVar4 = false;
    if (!bVar6 && this->reporter_ == (Reporter *)0x0) goto LAB_002de7a9;
  }
  else {
    bVar5 = IsTreatedAsSmartSet(this,repeated_field);
    bVar4 = true;
    if (bVar5 || bVar3) goto LAB_002de42e;
  }
  local_a0.unknown_field_number = -1;
  local_a0.unknown_field_type = TYPE_VARINT;
  local_a0.index = -1;
  local_a0.new_index = -1;
  local_a0.map_entry1 = (Message *)0x0;
  local_a0.map_entry2 = (Message *)0x0;
  local_a0.unknown_field_set1 = (UnknownFieldSet *)0x0;
  local_a0.unknown_field_set2 = (UnknownFieldSet *)0x0;
  local_a0.unknown_field_index1 = -1;
  local_a0.unknown_field_index2 = -1;
  local_a0.forced_compare_no_presence_ = false;
  lVar11 = 0;
  bVar7 = 0;
  local_fc = 0;
  local_a0.message1 = message1;
  local_a0.message2 = message2;
  local_a0.unpacked_any = unpacked_any;
  local_a0.field = repeated_field;
  while( true ) {
    index = (int)lVar11;
    if (((int)uVar8 <= lVar11) || ((bool)((int)uVar9 <= lVar11 & bVar4))) break;
    if ((bVar4) ||
       (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar11] != -1)) {
      if (bVar3) {
        v2 = local_fc;
        for (lVar13 = (long)local_fc;
            lVar13 < match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11]; lVar13 = lVar13 + 1) {
          psVar10 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_(0,v2,"0 <= j");
          if (psVar10 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                       ,0x517,psVar10->_M_string_length,(psVar10->_M_dataplus)._M_p);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
          }
          if (this->reporter_ == (Reporter *)0x0) goto LAB_002de7a1;
          local_a0.index = v2;
          AddSpecificNewIndex(&local_a0,message2,repeated_field,v2);
          std::
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ::push_back(parent_fields,&local_a0);
          (*this->reporter_->_vptr_Reporter[2])(this->reporter_,message1,message2,parent_fields);
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
          match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] = -2;
          v2 = v2 + 1;
          bVar7 = 1;
        }
      }
      AddSpecificIndex(&local_a0,message1,repeated_field,index);
      if (bVar4) {
        AddSpecificNewIndex(&local_a0,message2,repeated_field,index);
      }
      else {
        AddSpecificNewIndex(&local_a0,message2,repeated_field,
                            match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar11]);
        local_fc = match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11] + 1;
      }
      bVar5 = CompareFieldValueUsingParentFields
                        (this,message1,message2,unpacked_any,repeated_field,index,local_a0.new_index
                         ,parent_fields);
      if (!bVar5) {
        if (this->reporter_ == (Reporter *)0x0) goto LAB_002de7a1;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[4])(this->reporter_,message1,message2,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        goto LAB_002de792;
      }
      if (this->reporter_ == (Reporter *)0x0) {
LAB_002de6ee:
        if ((this->report_matches_ != true) || (this->reporter_ == (Reporter *)0x0))
        goto LAB_002de799;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[6])(this->reporter_,message1,message2,parent_fields);
      }
      else {
        if (((local_a0.index == local_a0.new_index) ||
            (bVar5 = FieldDescriptor::is_map(local_a0.field), bVar5)) ||
           (this->report_moves_ != true)) goto LAB_002de6ee;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[5])(this->reporter_,message1,message2,parent_fields);
      }
      ppSVar1 = &(parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
    }
    else if (bVar3) {
      if (this->reporter_ == (Reporter *)0x0) {
LAB_002de7a1:
        bVar5 = false;
        goto LAB_002de7a9;
      }
      AddSpecificIndex(&local_a0,message1,repeated_field,index);
      std::
      vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ::push_back(parent_fields,&local_a0);
      (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
      ppSVar1 = &(parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = -2;
LAB_002de792:
      bVar7 = 1;
    }
LAB_002de799:
    lVar11 = lVar11 + 1;
  }
  uVar12 = 0;
  uVar14 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar14 = uVar12;
  }
  for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
    if (bVar4) {
      if ((long)(int)uVar8 <= (long)uVar12) {
LAB_002de80d:
        bVar7 = bVar7 | !bVar2;
        if (this->reporter_ != (Reporter *)0x0) {
          local_a0.index = (int)uVar12;
          AddSpecificNewIndex(&local_a0,message2,repeated_field,(int)uVar12);
          std::
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ::push_back(parent_fields,&local_a0);
          (*this->reporter_->_vptr_Reporter[2])(this->reporter_,message1,message2,parent_fields);
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
        }
      }
    }
    else if (match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12] == -1) goto LAB_002de80d;
  }
  uVar12 = 0;
  uVar14 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar14 = uVar12;
  }
  for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
    if (bVar4) {
      if ((long)(int)uVar9 <= (long)uVar12) {
LAB_002de89f:
        if (this->reporter_ == (Reporter *)0x0) {
          __assert_fail("reporter_ != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                        ,0x559,
                        "bool google::protobuf::util::MessageDifferencer::CompareRepeatedRep(const Message &, const Message &, int, const FieldDescriptor *, std::vector<SpecificField> *)"
                       );
        }
        AddSpecificIndex(&local_a0,message1,repeated_field,(int)uVar12);
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back(parent_fields,&local_a0);
        (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        bVar7 = 1;
      }
    }
    else if (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12] == -1) goto LAB_002de89f;
  }
  bVar5 = (bool)(bVar7 ^ 1);
LAB_002de7a9:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&match_list2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&match_list1.super__Vector_base<int,_std::allocator<int>_>);
  return bVar5;
}

Assistant:

bool MessageDifferencer::CompareRepeatedRep(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  // the input FieldDescriptor is guaranteed to be repeated field.
  ABSL_DCHECK(repeated_field->is_repeated());
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  const int count1 = reflection1->FieldSize(message1, repeated_field);
  const int count2 = reflection2->FieldSize(message2, repeated_field);
  const bool treated_as_subset = IsTreatedAsSubset(repeated_field);

  // If the field is not treated as subset and no detailed reports is needed,
  // we do a quick check on the number of the elements to avoid unnecessary
  // comparison.
  if (count1 != count2 && reporter_ == NULL && !treated_as_subset) {
    return false;
  }
  // A match can never be found if message1 has more items than message2.
  if (count1 > count2 && reporter_ == NULL) {
    return false;
  }

  // These two list are used for store the index of the correspondent
  // element in peer repeated field.
  std::vector<int> match_list1;
  std::vector<int> match_list2;

  const MapKeyComparator* key_comparator = GetMapKeyComparator(repeated_field);
  bool smart_list = IsTreatedAsSmartList(repeated_field);
  bool simple_list = key_comparator == nullptr &&
                     !IsTreatedAsSet(repeated_field) &&
                     !IsTreatedAsSmartSet(repeated_field) && !smart_list;

  // For simple lists, we avoid matching repeated field indices, saving the
  // memory allocations that would otherwise be needed for match_list1 and
  // match_list2.
  if (!simple_list) {
    // Try to match indices of the repeated fields. Return false if match fails.
    if (!MatchRepeatedFieldIndices(
            message1, message2, unpacked_any, repeated_field, key_comparator,
            *parent_fields, &match_list1, &match_list2) &&
        reporter_ == nullptr) {
      return false;
    }
  }

  bool fieldDifferent = false;
  SpecificField specific_field;
  specific_field.message1 = &message1;
  specific_field.message2 = &message2;
  specific_field.unpacked_any = unpacked_any;
  specific_field.field = repeated_field;

  // At this point, we have already matched pairs of fields (with the reporting
  // to be done later). Now to check if the paired elements are different.
  int next_unmatched_index = 0;
  for (int i = 0; i < count1; i++) {
    if (simple_list && i >= count2) {
      break;
    }
    if (!simple_list && match_list1[i] == -1) {
      if (smart_list) {
        if (reporter_ == nullptr) return false;
        AddSpecificIndex(&specific_field, message1, repeated_field, i);
        parent_fields->push_back(specific_field);
        reporter_->ReportDeleted(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list1[i] = -2;
      }
      continue;
    }
    if (smart_list) {
      for (int j = next_unmatched_index; j < match_list1[i]; ++j) {
        ABSL_CHECK_LE(0, j);
        if (reporter_ == nullptr) return false;
        specific_field.index = j;
        AddSpecificNewIndex(&specific_field, message2, repeated_field, j);
        parent_fields->push_back(specific_field);
        reporter_->ReportAdded(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list2[j] = -2;
      }
    }
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    if (simple_list) {
      AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    } else {
      AddSpecificNewIndex(&specific_field, message2, repeated_field,
                          match_list1[i]);
      next_unmatched_index = match_list1[i] + 1;
    }

    const bool result = CompareFieldValueUsingParentFields(
        message1, message2, unpacked_any, repeated_field, i,
        specific_field.new_index, parent_fields);

    // If we have found differences, either report them or terminate if
    // no reporter is present. Note that ReportModified, ReportMoved, and
    // ReportMatched are all mutually exclusive.
    if (!result) {
      if (reporter_ == NULL) return false;
      parent_fields->push_back(specific_field);
      reporter_->ReportModified(message1, message2, *parent_fields);
      parent_fields->pop_back();
      fieldDifferent = true;
    } else if (reporter_ != NULL &&
               specific_field.index != specific_field.new_index &&
               !specific_field.field->is_map() && report_moves_) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMoved(message1, message2, *parent_fields);
      parent_fields->pop_back();
    } else if (report_matches_ && reporter_ != NULL) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMatched(message1, message2, *parent_fields);
      parent_fields->pop_back();
    }
  }

  // Report any remaining additions or deletions.
  for (int i = 0; i < count2; ++i) {
    if (!simple_list && match_list2[i] != -1) continue;
    if (simple_list && i < count1) continue;
    if (!treated_as_subset) {
      fieldDifferent = true;
    }

    if (reporter_ == NULL) continue;
    specific_field.index = i;
    AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportAdded(message1, message2, *parent_fields);
    parent_fields->pop_back();
  }

  for (int i = 0; i < count1; ++i) {
    if (!simple_list && match_list1[i] != -1) continue;
    if (simple_list && i < count2) continue;
    assert(reporter_ != NULL);
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportDeleted(message1, message2, *parent_fields);
    parent_fields->pop_back();
    fieldDifferent = true;
  }
  return !fieldDifferent;
}